

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Map.cpp
# Opt level: O1

void __thiscall RenX::Map::Map(Map *this,string_view in_name)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->guid[0] = 0;
  this->guid[1] = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->name,0,0,in_name._M_str,in_name._M_len);
  return;
}

Assistant:

RenX::Map::Map(std::string_view in_name) : Map()
{
	name = in_name;
}